

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O3

deBool deProcess_closeStdOut(deProcess *process)

{
  deFile *file;
  
  file = process->standardOut;
  if (file != (deFile *)0x0) {
    deFile_destroy(file);
    process->standardOut = (deFile *)0x0;
  }
  return (uint)(file != (deFile *)0x0);
}

Assistant:

deBool deProcess_closeStdOut (deProcess* process)
{
	if (process->standardOut)
	{
		deFile_destroy(process->standardOut);
		process->standardOut = DE_NULL;
		return DE_TRUE;
	}
	else
		return DE_FALSE;
}